

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall RandomBotStrategy::sendRandomArmies(RandomBotStrategy *this)

{
  int iVar1;
  result_type_conflict rVar2;
  uniform_int_distribution<int> local_1c;
  uniform_int_distribution<int> dis;
  int maxArmies;
  RandomBotStrategy *this_local;
  
  unique0x1000007f = this;
  iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
  dis._M_param._M_a = iVar1 + -1;
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_1c,0,dis._M_param._M_a);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_1c,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008);
  return rVar2;
}

Assistant:

int RandomBotStrategy::sendRandomArmies(std::mt19937 gen) {
    int maxArmies = this->from->getNumberOfTroops() - 1;
    std::uniform_int_distribution<> dis(0, maxArmies);
    return dis(gen);
}